

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::anon_unknown_0::FractCaseInstance::getInputValues
          (FractCaseInstance *this,int numValues,void **values)

{
  deUint32 dVar1;
  const_reference pvVar2;
  ShaderSpec *this_00;
  float fVar3;
  float fVar4;
  float b;
  Float<unsigned_short,_5,_10,_15,_3U> local_76;
  int local_74;
  float local_70;
  int ndx_1;
  float v;
  int ndx;
  int numSpecialCases;
  int local_54;
  Precision local_50;
  int scalarSize;
  Precision precision;
  DataType type;
  Random rnd;
  Vec2 ranges [3];
  void **values_local;
  int numValues_local;
  FractCaseInstance *this_local;
  
  ranges[2].m_data = (float  [2])values;
  tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&rnd.m_rnd.z,-2.0,2.0);
  tcu::Vector<float,_2>::Vector(ranges,-1000.0,1000.0);
  tcu::Vector<float,_2>::Vector(ranges + 1,-1e+07,1e+07);
  dVar1 = deStringHash((this->super_CommonFunctionTestInstance).m_name);
  de::Random::Random((Random *)&precision,dVar1 ^ 0xac23f);
  this_00 = &(this->super_CommonFunctionTestInstance).m_spec;
  pvVar2 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
           operator[](&this_00->inputs,0);
  scalarSize = glu::VarType::getBasicType(&pvVar2->varType);
  pvVar2 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
           operator[](&this_00->inputs,0);
  local_50 = glu::VarType::getPrecision(&pvVar2->varType);
  local_54 = glu::getDataTypeScalarSize(scalarSize);
  v = 0.0;
  if (local_50 != PRECISION_LOWP) {
    for (ndx_1 = 0; ndx_1 < 10; ndx_1 = ndx_1 + 1) {
      fVar3 = (float)ndx_1;
      fVar4 = tcu::Vector<float,_2>::x(ranges + ((ulong)local_50 - 1));
      b = tcu::Vector<float,_2>::y(ranges + ((ulong)local_50 - 1));
      local_70 = de::clamp<float>(fVar3 + -5.5,fVar4,b);
      std::fill<float*,float>
                (*(float **)ranges[2].m_data,*(float **)ranges[2].m_data + local_54,&local_70);
      v = (float)((int)v + 1);
    }
  }
  fVar3 = tcu::Vector<float,_2>::x(ranges + ((ulong)local_50 - 1));
  fVar4 = tcu::Vector<float,_2>::y(ranges + ((ulong)local_50 - 1));
  fillRandomScalars<float>
            ((Random *)&precision,fVar3,fVar4,
             (void *)(*(long *)ranges[2].m_data + (long)((int)v * local_54) * 4),
             (numValues - (int)v) * local_54,0);
  if (local_50 == PRECISION_MEDIUMP) {
    for (local_74 = 0; local_74 < numValues * local_54; local_74 = local_74 + 1) {
      tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float
                (&local_76,*(float *)(*(long *)ranges[2].m_data + (long)local_74 * 4));
      fVar3 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::asFloat(&local_76);
      *(float *)(*(long *)ranges[2].m_data + (long)local_74 * 4) = fVar3;
    }
  }
  de::Random::~Random((Random *)&precision);
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		const Vec2 ranges[] =
		{
			Vec2(-2.0f,		2.0f),	// lowp
			Vec2(-1e3f,		1e3f),	// mediump
			Vec2(-1e7f,		1e7f)	// highp
		};

		de::Random				rnd				(deStringHash(m_name) ^ 0xac23fu);
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		int						numSpecialCases	= 0;

		// Special cases.
		if (precision != glu::PRECISION_LOWP)
		{
			DE_ASSERT(numValues >= 10);
			for (int ndx = 0; ndx < 10; ndx++)
			{
				const float v = de::clamp(float(ndx) - 5.5f, ranges[precision].x(), ranges[precision].y());
				std::fill((float*)values[0], (float*)values[0] + scalarSize, v);
				numSpecialCases += 1;
			}
		}

		// Random cases.
		fillRandomScalars(rnd, ranges[precision].x(), ranges[precision].y(), (float*)values[0] + numSpecialCases*scalarSize, (numValues-numSpecialCases)*scalarSize);

		// If precision is mediump, make sure values can be represented in fp16 exactly
		if (precision == glu::PRECISION_MEDIUMP)
		{
			for (int ndx = 0; ndx < numValues*scalarSize; ndx++)
				((float*)values[0])[ndx] = tcu::Float16(((float*)values[0])[ndx]).asFloat();
		}
	}